

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

void __thiscall PSBTInput::FromSignatureData(PSBTInput *this,SignatureData *sigdata)

{
  uint256 *puVar1;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *pmVar2;
  uint uVar3;
  long lVar4;
  size_type sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  _Base_ptr p_Var12;
  uchar *puVar13;
  uint uVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__args_1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  _Rb_tree_header *p_Var16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (sigdata->complete == true) {
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::clear(&(this->partial_sigs)._M_t);
    std::
    _Rb_tree<CPubKey,_std::pair<const_CPubKey,_KeyOriginInfo>,_std::_Select1st<std::pair<const_CPubKey,_KeyOriginInfo>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
    ::clear(&(this->hd_keypaths)._M_t);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
              (&(this->redeem_script).super_CScriptBase,0);
    uVar3 = (this->redeem_script).super_CScriptBase._size;
    sVar5 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      sVar5 = uVar3;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
              (&(this->redeem_script).super_CScriptBase,sVar5);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
              (&(this->witness_script).super_CScriptBase,0);
    uVar3 = (this->witness_script).super_CScriptBase._size;
    sVar5 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      sVar5 = uVar3;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
              (&(this->witness_script).super_CScriptBase,sVar5);
    uVar3 = (sigdata->scriptSig).super_CScriptBase._size;
    uVar14 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar14 = uVar3;
    }
    if (uVar14 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(this->final_script_sig).super_CScriptBase,&(sigdata->scriptSig).super_CScriptBase
                );
    }
    if ((sigdata->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (sigdata->scriptWitness).stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator=(&(this->final_script_witness).stack,&(sigdata->scriptWitness).stack);
        return;
      }
      goto LAB_006dc96c;
    }
  }
  else {
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
    ::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                *)&this->partial_sigs,
               (sigdata->signatures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                )&(sigdata->signatures)._M_t._M_impl.super__Rb_tree_header);
    uVar3 = (this->redeem_script).super_CScriptBase._size;
    uVar14 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar14 = uVar3;
    }
    uVar15 = extraout_RDX;
    if (uVar14 == 0) {
      uVar3 = (sigdata->redeem_script).super_CScriptBase._size;
      uVar14 = uVar3 - 0x1d;
      if (uVar3 < 0x1d) {
        uVar14 = uVar3;
      }
      if (uVar14 != 0) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(this->redeem_script).super_CScriptBase,
                   &(sigdata->redeem_script).super_CScriptBase);
        uVar15 = extraout_RDX_00;
      }
    }
    uVar3 = (this->witness_script).super_CScriptBase._size;
    uVar14 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar14 = uVar3;
    }
    __args_1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)uVar14;
    if (uVar14 == 0) {
      uVar3 = (sigdata->witness_script).super_CScriptBase._size;
      uVar14 = uVar3 - 0x1d;
      if (uVar3 < 0x1d) {
        uVar14 = uVar3;
      }
      __args_1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)uVar14;
      if (uVar14 != 0) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(this->witness_script).super_CScriptBase,
                   &(sigdata->witness_script).super_CScriptBase);
        uVar15 = extraout_RDX_01;
      }
    }
    p_Var12 = (sigdata->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    auVar17._8_8_ = uVar15;
    auVar17._0_8_ = p_Var12;
    p_Var16 = &(sigdata->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var16) {
      do {
        std::
        _Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
        ::_M_emplace_unique<std::pair<CPubKey,KeyOriginInfo>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>,_bool> *)
                   &this->hd_keypaths,
                   (_Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
                    *)&auVar17._0_8_[1]._M_right,auVar17._8_8_);
        auVar17 = std::_Rb_tree_increment(auVar17._0_8_);
      } while ((_Rb_tree_header *)auVar17._0_8_ != p_Var16);
    }
    if ((sigdata->taproot_key_path_sig).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sigdata->taproot_key_path_sig).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->m_tap_key_sig,&sigdata->taproot_key_path_sig);
    }
    p_Var12 = (sigdata->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(sigdata->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var16) {
      do {
        std::
        _Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::pair<XOnlyPubKey,uint256>const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&this->m_tap_script_sigs,
                   (_Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)(p_Var12 + 1),(pair<XOnlyPubKey,_uint256> *)(p_Var12 + 3),__args_1);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var16);
    }
    puVar1 = &(sigdata->tr_spenddata).merkle_root;
    puVar13 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (&sigdata->tr_spenddata,puVar1);
    if ((uint256 *)puVar13 != puVar1) {
      uVar6 = *(undefined4 *)
               (sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems;
      uVar7 = *(undefined4 *)
               ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems
               + 4);
      uVar8 = *(undefined4 *)
               ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems
               + 8);
      uVar9 = *(undefined4 *)
               ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems
               + 0xc);
      uVar15 = *(undefined8 *)
                ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data.
                 _M_elems + 0x18);
      *(undefined8 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)
            ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
            0x10);
      *(undefined8 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar15;
      *(undefined4 *)(this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
           uVar6;
      *(undefined4 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 4) = uVar7;
      *(undefined4 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) = uVar8;
      *(undefined4 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0xc) = uVar9;
    }
    pmVar2 = &(sigdata->tr_spenddata).scripts;
    puVar13 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (puVar1,pmVar2);
    if ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
         *)puVar13 != pmVar2) {
      uVar15 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uVar10 = *(undefined8 *)
                ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 8);
      uVar11 = *(undefined8 *)
                ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)
            ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18) =
           uVar11;
      *(undefined8 *)(this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems = uVar15;
      *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 8) = uVar10;
    }
    p_Var12 = (sigdata->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(sigdata->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var16) {
      do {
        std::
        _Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
        ::
        _M_emplace_unique<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const&,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>
                  ((_Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                    *)&this->m_tap_scripts,
                   (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                   (p_Var12 + 1),
                   (set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(p_Var12 + 2));
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var16);
    }
    p_Var12 = (sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var16) {
      do {
        std::
        _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
        ::
        _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
                  ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                    *)&this->m_tap_bip32_paths,(XOnlyPubKey *)(p_Var12 + 1),
                   (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                    *)(p_Var12 + 2));
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var16);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
LAB_006dc96c:
  __stack_chk_fail();
}

Assistant:

void PSBTInput::FromSignatureData(const SignatureData& sigdata)
{
    if (sigdata.complete) {
        partial_sigs.clear();
        hd_keypaths.clear();
        redeem_script.clear();
        witness_script.clear();

        if (!sigdata.scriptSig.empty()) {
            final_script_sig = sigdata.scriptSig;
        }
        if (!sigdata.scriptWitness.IsNull()) {
            final_script_witness = sigdata.scriptWitness;
        }
        return;
    }

    partial_sigs.insert(sigdata.signatures.begin(), sigdata.signatures.end());
    if (redeem_script.empty() && !sigdata.redeem_script.empty()) {
        redeem_script = sigdata.redeem_script;
    }
    if (witness_script.empty() && !sigdata.witness_script.empty()) {
        witness_script = sigdata.witness_script;
    }
    for (const auto& entry : sigdata.misc_pubkeys) {
        hd_keypaths.emplace(entry.second);
    }
    if (!sigdata.taproot_key_path_sig.empty()) {
        m_tap_key_sig = sigdata.taproot_key_path_sig;
    }
    for (const auto& [pubkey_leaf, sig] : sigdata.taproot_script_sigs) {
        m_tap_script_sigs.emplace(pubkey_leaf, sig);
    }
    if (!sigdata.tr_spenddata.internal_key.IsNull()) {
        m_tap_internal_key = sigdata.tr_spenddata.internal_key;
    }
    if (!sigdata.tr_spenddata.merkle_root.IsNull()) {
        m_tap_merkle_root = sigdata.tr_spenddata.merkle_root;
    }
    for (const auto& [leaf_script, control_block] : sigdata.tr_spenddata.scripts) {
        m_tap_scripts.emplace(leaf_script, control_block);
    }
    for (const auto& [pubkey, leaf_origin] : sigdata.taproot_misc_pubkeys) {
        m_tap_bip32_paths.emplace(pubkey, leaf_origin);
    }
}